

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  longdouble lVar1;
  int iVar2;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar4;
  type plVar5;
  type prVar6;
  type piVar7;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble a;
  type *last;
  type *first;
  undefined1 auStack_48 [8];
  longdouble sum_a_pi_p;
  int local_2c;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Stack_28;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  *this_local;
  
  local_2c = 0;
  _Stack_28._M_head_impl = (col_value *)x;
  x_local = (bit_array *)end;
  begin_local = (row_iterator)this;
  for (end_local = begin; end_local != (row_iterator)x_local; end_local = end_local + 1) {
    _auStack_48 = (longdouble)0;
    sparse_matrix<int>::column((sparse_matrix<int> *)&first,(int)this + 0x10);
    ppcVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    ppcVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    lVar8 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    while (iVar2 = local_2c, *ppcVar3 != *ppcVar4) {
      this_00 = &this->A;
      std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                (this_00,(long)(*ppcVar3)->value);
      std::abs((int)this_00);
      plVar5 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar3)->row);
      lVar1 = *plVar5;
      plVar5 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar3)->value);
      _auStack_48 = _auStack_48 + lVar8 * (*plVar5 + lVar1);
      *ppcVar3 = *ppcVar3 + 1;
      lVar8 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST5 = in_ST4;
    }
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar6->id = iVar2;
    piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->A,(long)end_local->value);
    iVar2 = *piVar7;
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar6->f = iVar2;
    default_cost_type<long_double>::operator()
              ((longdouble *)this->c,
               (default_cost_type<long_double> *)(ulong)(uint)end_local->column,
               (int)_Stack_28._M_head_impl,(bit_array *)prVar6);
    lVar8 = lVar8 - _auStack_48;
    in_ST6 = in_ST5;
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar6->value = lVar8;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }